

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall
KDIS::NETWORK::Connection::Connection
          (Connection *this,KString *SendAddress,KUINT32 Port,KBOOL SendAddressIsMulticast,
          KBOOL Blocking,PDU_Factory *Custom,KBOOL SendOnly)

{
  PDU_Factory *this_00;
  KBOOL SendOnly_local;
  PDU_Factory *Custom_local;
  KBOOL Blocking_local;
  KBOOL SendAddressIsMulticast_local;
  KUINT32 Port_local;
  KString *SendAddress_local;
  Connection *this_local;
  
  this->_vptr_Connection = (_func_int **)&PTR__Connection_0032ab80;
  this->m_uiPort = Port;
  std::__cxx11::string::string((string *)&this->m_sSendAddress);
  this->m_bBlockingSocket = Blocking;
  this->m_bSendOnly = SendOnly;
  std::
  vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
  ::vector(&this->m_vpSubscribers);
  KDataStream::KDataStream(&this->m_stream,Big_Endian);
  std::__cxx11::string::string((string *)&this->m_sLastIP);
  this->m_iSocket[0] = 0;
  this->m_iSocket[1] = 0;
  (this->m_blockingTimeout).tv_sec = 0;
  (this->m_blockingTimeout).tv_usec = 0;
  startup(this);
  (*this->_vptr_Connection[2])(this,SendAddress,(ulong)(SendAddressIsMulticast & 1));
  (*this->_vptr_Connection[6])(this,(ulong)(Blocking & 1));
  if (Custom == (PDU_Factory *)0x0) {
    this_00 = (PDU_Factory *)operator_new(0x20);
    UTILS::PDU_Factory::PDU_Factory(this_00);
    this->m_pPduFact = this_00;
  }
  else {
    this->m_pPduFact = Custom;
  }
  return;
}

Assistant:

Connection::Connection( const KString & SendAddress, KUINT32 Port /* = 3000 */, KBOOL SendAddressIsMulticast /* = false */,
                        KBOOL Blocking /* = true */, PDU_Factory * Custom /* = 0 */, KBOOL SendOnly /* = false*/) :
    m_uiPort( Port ),
    m_bBlockingSocket( Blocking ),
    m_bSendOnly( SendOnly )
{
    m_iSocket[SEND_SOCK] = 0;
    m_iSocket[RECEIVE_SOCK] = 0;

    m_blockingTimeout.tv_sec = 0;
    m_blockingTimeout.tv_usec = 0;

    startup();

    SetSendAddress( SendAddress, SendAddressIsMulticast );

    SetBlockingModeEnabled( Blocking );

    // Should we use the standard PDU_Factory or have we been supplied we a customised one?
    if( Custom )
    {
        m_pPduFact = Custom;
    }
    else
    {
        m_pPduFact = new PDU_Factory;
    }
}